

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O3

void add_object(state *s,uint32_t handle,uint32_t class)

{
  rnnvalue **pprVar1;
  uint64_t uVar2;
  rnnenum *prVar3;
  rnnenum *prVar4;
  rnndeccontext *ctx;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  prVar3 = rnn_findenum(s->db,"chipset");
  prVar4 = rnn_findenum(s->db,"obj-class");
  if ((prVar4 == (rnnenum *)0x0) || (prVar3 == (rnnenum *)0x0)) {
    add_object_cold_1();
  }
  lVar8 = 0;
  while (*(int *)((long)&s->objects[0].handle + lVar8) != 0) {
    lVar8 = lVar8 + 0x18;
    if (lVar8 == 0x1800) {
      add_object_cold_2();
      return;
    }
  }
  *(uint32_t *)((long)&s->objects[0].handle + lVar8) = handle;
  *(uint32_t *)((long)&s->objects[0].class + lVar8) = class;
  ctx = rnndec_newcontext(s->db);
  *(rnndeccontext **)((long)&s->objects[0].ctx + lVar8) = ctx;
  ctx->colors = s->colors;
  pcVar6 = "NV1";
  if (0 < (long)prVar3->valsnum) {
    lVar7 = 0;
    do {
      pprVar1 = prVar3->vals + lVar7;
      uVar2 = (*pprVar1)->value;
      if (uVar2 == s->chipset) break;
      bVar9 = (long)prVar3->valsnum + -1 != lVar7;
      lVar7 = lVar7 + 1;
    } while (bVar9);
    if (uVar2 == s->chipset) {
      pcVar6 = (*pprVar1)->name;
    }
  }
  rnndec_varadd(ctx,"chipset",pcVar6);
  pcVar6 = "NV1_NULL";
  if (0 < (long)prVar4->valsnum) {
    lVar7 = 0;
    do {
      pprVar1 = prVar4->vals + lVar7;
      uVar2 = (*pprVar1)->value;
      if (uVar2 == class) break;
      bVar9 = (long)prVar4->valsnum + -1 != lVar7;
      lVar7 = lVar7 + 1;
    } while (bVar9);
    if (uVar2 == class) {
      pcVar5 = (*pprVar1)->name;
      pcVar6 = pcVar5;
      goto LAB_00102650;
    }
  }
  pcVar5 = (char *)0x0;
LAB_00102650:
  *(char **)((long)&s->objects[0].name + lVar8) = pcVar5;
  rnndec_varadd(*(rnndeccontext **)((long)&s->objects[0].ctx + lVar8),"obj-class",pcVar6);
  return;
}

Assistant:

void
add_object(struct state *s, uint32_t handle, uint32_t class)
{
	struct rnnenum *chs = rnn_findenum(s->db, "chipset");
	struct rnnenum *cls = rnn_findenum(s->db, "obj-class");
	struct rnnvalue *v;
	struct obj *obj;
	int i;

	if (!cls || !chs) {
		fprintf(stderr, "No obj-class/chipset enum found\n");
		abort();
	}

	for (i = 0; obj = &s->objects[i], i < MAX_OBJECTS; i++) {
		if (!obj->handle) {
			obj->handle = handle;
			obj->class = class;
			obj->ctx = rnndec_newcontext(s->db);
			obj->ctx->colors = s->colors;

			v = NULL;
			FINDARRAY(chs->vals, v, v->value == s->chipset);
			rnndec_varadd(obj->ctx, "chipset",
				      v ? v->name : "NV1");

			v = NULL;
			FINDARRAY(cls->vals, v, v->value == class);
			obj->name = v ? v->name : NULL;
			rnndec_varadd(obj->ctx, "obj-class",
				      v ? v->name : "NV1_NULL");

			return;
		}
	}

	fprintf(stderr, "Too many objects\n");
}